

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O3

void readHeader(char *fileName)

{
  int iVar1;
  Header *pHVar2;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar3;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar4;
  ostream *poVar5;
  RgbaInputFile file;
  RgbaInputFile local_50 [64];
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_50,fileName,iVar1);
  pHVar2 = (Header *)Imf_3_4::RgbaInputFile::header();
  pTVar3 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>
                     (pHVar2,"comments");
  pHVar2 = (Header *)Imf_3_4::RgbaInputFile::header();
  pTVar4 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                     (pHVar2,"cameraTransform");
  if (pTVar3 != (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comments\n   ",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(pTVar3 + 8),*(long *)(pTVar3 + 0x10));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (pTVar4 != (TypedAttribute<Imath_3_2::Matrix44<float>_> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cameraTransform\n",0x10);
    Imath_3_2::operator<<((ostream *)&std::cout,(Matrix44<float> *)(pTVar4 + 8));
    std::ostream::flush();
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_50);
  return;
}

Assistant:

void
readHeader (const char fileName[])
{
    //
    // Read an image's header from a file, and if the header
    // contains comments and camera transformation attributes,
    // print the values of those attributes.
    //
    //	- open the file
    //	- get the file header
    //	- look for the attributes
    //

    RgbaInputFile file (fileName);

    const StringAttribute* comments =
        file.header ().findTypedAttribute<StringAttribute> ("comments");

    const M44fAttribute* cameraTransform =
        file.header ().findTypedAttribute<M44fAttribute> ("cameraTransform");

    if (comments) cout << "comments\n   " << comments->value () << endl;

    if (cameraTransform)
        cout << "cameraTransform\n" << cameraTransform->value () << flush;
}